

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatters_test.cpp
# Opt level: O3

void test_chars_encoding(char *value,vector<unsigned_char,_std::allocator<unsigned_char>_> *expected
                        )

{
  ostringstream *os;
  pointer __s1;
  int iVar1;
  size_t sVar2;
  MessageBuilder *pMVar3;
  ResultBuilder *pRVar4;
  size_t size;
  long lVar5;
  size_t __nbytes;
  bool bVar6;
  int32_t read_offset;
  string_ref read_back;
  ScopedMessage scopedMessage48;
  ResultBuilder __catchResult;
  ScopedMessage scopedMessage42;
  array<unsigned_char,_1024UL> buffer;
  int local_828;
  int local_824;
  undefined1 local_820 [40];
  char *local_7f8;
  string local_7f0;
  char *local_7d0;
  size_t local_7c8;
  undefined1 local_7c0 [8];
  undefined1 *local_7b8;
  undefined1 local_7b0 [104];
  undefined1 local_748 [232];
  ios_base local_660 [440];
  ScopedMessage local_4a8;
  char local_430 [1024];
  
  local_828 = 0;
  local_7f8 = value;
  sVar2 = strlen(value);
  cornelich::util::stop_bit::write((int)local_430,&local_828,sVar2);
  iVar1 = local_828;
  if (sVar2 != 0) {
    memcpy(local_430 + local_828,value,sVar2);
    local_828 = (int)sVar2 + iVar1;
  }
  local_820._0_8_ = local_820 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_820,"INFO","");
  Catch::SourceLineInfo::SourceLineInfo
            ((SourceLineInfo *)local_7c0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/jh0x[P]cornelich/cornelich_test/formatters_test.cpp"
             ,0x2a);
  Catch::MessageBuilder::MessageBuilder
            ((MessageBuilder *)local_748,(string *)local_820,(SourceLineInfo *)local_7c0,Info);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_748 + 0x78),"value=",6);
  pMVar3 = Catch::MessageBuilder::operator<<((MessageBuilder *)local_748,&local_7f8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&pMVar3->m_stream,", write_offset=",0xf);
  std::ostream::operator<<(&pMVar3->m_stream,local_828);
  Catch::ScopedMessage::ScopedMessage(&local_4a8,pMVar3);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_748 + 0x78));
  std::ios_base::~ios_base(local_660);
  if ((undefined1 *)local_748._80_8_ != local_748 + 0x60) {
    operator_delete((void *)local_748._80_8_);
  }
  if ((undefined1 *)local_748._32_8_ != local_748 + 0x30) {
    operator_delete((void *)local_748._32_8_);
  }
  if ((undefined1 *)local_748._0_8_ != local_748 + 0x10) {
    operator_delete((void *)local_748._0_8_);
  }
  if (local_7c0 != (undefined1  [8])local_7b0) {
    operator_delete((void *)local_7c0);
  }
  if ((undefined1 *)local_820._0_8_ != local_820 + 0x10) {
    operator_delete((void *)local_820._0_8_);
  }
  Catch::SourceLineInfo::SourceLineInfo
            ((SourceLineInfo *)local_7c0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/jh0x[P]cornelich/cornelich_test/formatters_test.cpp"
             ,0x2b);
  Catch::ResultBuilder::ResultBuilder
            ((ResultBuilder *)local_748,"REQUIRE",(SourceLineInfo *)local_7c0,
             "write_offset == expected.size()",Normal);
  if (local_7c0 != (undefined1  [8])local_7b0) {
    operator_delete((void *)local_7c0);
  }
  local_820._0_8_ =
       (expected->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
       super__Vector_impl_data._M_finish +
       -(long)(expected->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_start;
  local_7c0 = (undefined1  [8])local_748;
  local_7b8 = (undefined1 *)&local_828;
  pRVar4 = Catch::ExpressionLhs<int_const&>::
           captureExpression<(Catch::Internal::Operator)0,unsigned_long>
                     ((ExpressionLhs<int_const&> *)local_7c0,(unsigned_long *)local_820);
  Catch::ResultBuilder::endExpression(pRVar4);
  Catch::ResultBuilder::shouldDebugBreak((ResultBuilder *)local_748);
  Catch::ResultBuilder::react((ResultBuilder *)local_748);
  Catch::ResultBuilder::~ResultBuilder((ResultBuilder *)local_748);
  Catch::SourceLineInfo::SourceLineInfo
            ((SourceLineInfo *)local_7c0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/jh0x[P]cornelich/cornelich_test/formatters_test.cpp"
             ,0x2c);
  Catch::ResultBuilder::ResultBuilder
            ((ResultBuilder *)local_748,"REQUIRE",(SourceLineInfo *)local_7c0,
             "std::equal(expected.begin(), expected.end(), buffer.begin())",Normal);
  if (local_7c0 != (undefined1  [8])local_7b0) {
    operator_delete((void *)local_7c0);
  }
  __s1 = (expected->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
         super__Vector_impl_data._M_start;
  sVar2 = (long)(expected->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                _M_impl.super__Vector_impl_data._M_finish - (long)__s1;
  if (sVar2 == 0) {
    bVar6 = true;
  }
  else {
    iVar1 = bcmp(__s1,local_430,sVar2);
    bVar6 = iVar1 == 0;
  }
  local_7b8 = (undefined1 *)CONCAT71(local_7b8._1_7_,bVar6);
  local_7c0 = (undefined1  [8])local_748;
  Catch::ExpressionLhs<bool>::endExpression((ExpressionLhs<bool> *)local_7c0);
  Catch::ResultBuilder::shouldDebugBreak((ResultBuilder *)local_748);
  Catch::ResultBuilder::react((ResultBuilder *)local_748);
  Catch::ResultBuilder::~ResultBuilder((ResultBuilder *)local_748);
  local_824 = 0;
  size = cornelich::util::stop_bit::read((int)local_430,&local_824,__nbytes);
  lVar5 = (long)local_824;
  local_824 = (int)size + local_824;
  local_7f0._M_dataplus._M_p = (pointer)&local_7f0.field_2;
  local_7d0 = local_430 + lVar5;
  local_7c8 = size;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7f0,"INFO","");
  Catch::SourceLineInfo::SourceLineInfo
            ((SourceLineInfo *)local_820,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/jh0x[P]cornelich/cornelich_test/formatters_test.cpp"
             ,0x30);
  Catch::MessageBuilder::MessageBuilder
            ((MessageBuilder *)local_748,&local_7f0,(SourceLineInfo *)local_820,Info);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_748 + 0x78),"value=",6);
  pMVar3 = Catch::MessageBuilder::operator<<((MessageBuilder *)local_748,&local_7f8);
  os = &pMVar3->m_stream;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)os,", read_back=",0xc);
  boost::io::ostream_put<char,std::char_traits<char>>
            ((basic_ostream<char,_std::char_traits<char>_> *)os,local_430 + lVar5,size);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)os,", read_offset=",0xe);
  std::ostream::operator<<(os,local_824);
  Catch::ScopedMessage::ScopedMessage((ScopedMessage *)local_7c0,pMVar3);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_748 + 0x78));
  std::ios_base::~ios_base(local_660);
  if ((undefined1 *)local_748._80_8_ != local_748 + 0x60) {
    operator_delete((void *)local_748._80_8_);
  }
  if ((undefined1 *)local_748._32_8_ != local_748 + 0x30) {
    operator_delete((void *)local_748._32_8_);
  }
  if ((undefined1 *)local_748._0_8_ != local_748 + 0x10) {
    operator_delete((void *)local_748._0_8_);
  }
  if ((undefined1 *)local_820._0_8_ != local_820 + 0x10) {
    operator_delete((void *)local_820._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f0._M_dataplus._M_p != &local_7f0.field_2) {
    operator_delete(local_7f0._M_dataplus._M_p);
  }
  Catch::SourceLineInfo::SourceLineInfo
            ((SourceLineInfo *)local_820,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/jh0x[P]cornelich/cornelich_test/formatters_test.cpp"
             ,0x31);
  Catch::ResultBuilder::ResultBuilder
            ((ResultBuilder *)local_748,"REQUIRE",(SourceLineInfo *)local_820,
             "write_offset == read_offset",Normal);
  if ((undefined1 *)local_820._0_8_ != local_820 + 0x10) {
    operator_delete((void *)local_820._0_8_);
  }
  local_820._0_8_ = (ResultBuilder *)local_748;
  local_820._8_8_ = &local_828;
  pRVar4 = Catch::ExpressionLhs<int_const&>::captureExpression<(Catch::Internal::Operator)0,int>
                     ((ExpressionLhs<int_const&> *)local_820,&local_824);
  Catch::ResultBuilder::endExpression(pRVar4);
  Catch::ResultBuilder::shouldDebugBreak((ResultBuilder *)local_748);
  Catch::ResultBuilder::react((ResultBuilder *)local_748);
  Catch::ResultBuilder::~ResultBuilder((ResultBuilder *)local_748);
  Catch::SourceLineInfo::SourceLineInfo
            ((SourceLineInfo *)local_820,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/jh0x[P]cornelich/cornelich_test/formatters_test.cpp"
             ,0x32);
  Catch::ResultBuilder::ResultBuilder
            ((ResultBuilder *)local_748,"REQUIRE",(SourceLineInfo *)local_820,"read_back == value",
             Normal);
  if ((ResultBuilder *)local_820._0_8_ != (ResultBuilder *)(local_820 + 0x10)) {
    operator_delete((void *)local_820._0_8_);
  }
  local_820._8_8_ = &local_7d0;
  local_820._0_8_ = (ResultBuilder *)local_748;
  pRVar4 = Catch::ExpressionLhs<boost::basic_string_ref<char,std::char_traits<char>>const&>::
           captureExpression<(Catch::Internal::Operator)0,char_const*>
                     ((ExpressionLhs<boost::basic_string_ref<char,std::char_traits<char>>const&> *)
                      local_820,&local_7f8);
  Catch::ResultBuilder::endExpression(pRVar4);
  Catch::ResultBuilder::shouldDebugBreak((ResultBuilder *)local_748);
  Catch::ResultBuilder::react((ResultBuilder *)local_748);
  Catch::ResultBuilder::~ResultBuilder((ResultBuilder *)local_748);
  Catch::ScopedMessage::~ScopedMessage((ScopedMessage *)local_7c0);
  Catch::ScopedMessage::~ScopedMessage(&local_4a8);
  return;
}

Assistant:

void test_chars_encoding(const char * value, const std::vector<std::uint8_t> & expected)
{
    std::array<std::uint8_t, 1024> buffer;
    std::int32_t write_offset = 0;

    writers::chars()(buffer.data(), write_offset, value);
    INFO("value=" << value << ", write_offset=" << write_offset);
    REQUIRE(write_offset == expected.size());
    REQUIRE(std::equal(expected.begin(), expected.end(), buffer.begin()));

    std::int32_t read_offset = 0;
    auto read_back = readers::chars()(buffer.data(), read_offset);
    INFO("value=" << value << ", read_back=" << read_back << ", read_offset=" << read_offset);
    REQUIRE(write_offset == read_offset);
    REQUIRE(read_back == value);
}